

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadBoneAssignments(OgreXmlSerializer *this,VertexDataXml *dest)

{
  _Rb_tree_color _Var1;
  pointer pVVar2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  Logger *this_00;
  DeadlyImportError *this_01;
  iterator __begin4;
  pointer pVVar5;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2;
  pointer pVVar6;
  float fVar7;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> influencedVertices;
  char *local_1c8 [4];
  VertexBoneAssignment ba;
  
  if (dest != (VertexDataXml *)0x0) {
    influencedVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &influencedVertices._M_t._M_impl.super__Rb_tree_header._M_header;
    influencedVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    influencedVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    influencedVertices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    influencedVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         influencedVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    NextNode_abi_cxx11_(this);
    while (bVar3 = std::operator==(&this->m_currentNodeName,"vertexboneassignment"),
          p_Var4 = influencedVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left, bVar3) {
      ba.vertexIndex = ReadAttribute<unsigned_int>(this,"vertexindex");
      ba.boneIndex = ReadAttribute<unsigned_short>(this,"boneindex");
      ba.weight = ReadAttribute<float>(this,"weight");
      std::
      vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
      ::push_back(&(dest->super_IVertexData).boneAssignments,&ba);
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&influencedVertices,&ba.vertexIndex);
      NextNode_abi_cxx11_(this);
    }
    for (; (_Rb_tree_header *)p_Var4 != &influencedVertices._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      _Var1 = p_Var4[1]._M_color;
      pVVar2 = (dest->super_IVertexData).boneAssignments.
               super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      fVar7 = 0.0;
      pVVar5 = (dest->super_IVertexData).boneAssignments.
               super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (pVVar6 = pVVar5; pVVar6 != pVVar2; pVVar6 = pVVar6 + 1) {
        if (pVVar6->vertexIndex == _Var1) {
          fVar7 = fVar7 + pVVar6->weight;
        }
      }
      if ((fVar7 < 0.95) || (1.05 < fVar7)) {
        for (; pVVar5 != pVVar2; pVVar5 = pVVar5 + 1) {
          if (pVVar5->vertexIndex == _Var1) {
            pVVar5->weight = pVVar5->weight / fVar7;
          }
        }
      }
    }
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[5]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&ba,
               (char (*) [5])"  - ");
    std::ostream::_M_insert<unsigned_long>((ulong)&ba);
    std::operator<<((ostream *)&ba," bone assignments");
    std::__cxx11::stringbuf::str();
    Logger::debug(this_00,local_1c8[0]);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ba);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&influencedVertices._M_t);
    return;
  }
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&ba,"Cannot read bone assignments, vertex data is null.",
             (allocator *)&influencedVertices);
  DeadlyImportError::DeadlyImportError(this_01,(string *)&ba);
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreXmlSerializer::ReadBoneAssignments(VertexDataXml *dest)
{
    if (!dest) {
        throw DeadlyImportError("Cannot read bone assignments, vertex data is null.");
    }

    static const char *anVertexIndex = "vertexindex";
    static const char *anBoneIndex   = "boneindex";
    static const char *anWeight      = "weight";

    std::set<uint32_t> influencedVertices;

    NextNode();
    while(m_currentNodeName == nnVertexBoneAssignment)
    {
        VertexBoneAssignment ba;
        ba.vertexIndex = ReadAttribute<uint32_t>(anVertexIndex);
        ba.boneIndex = ReadAttribute<uint16_t>(anBoneIndex);
        ba.weight = ReadAttribute<float>(anWeight);

        dest->boneAssignments.push_back(ba);
        influencedVertices.insert(ba.vertexIndex);

        NextNode();
    }

    /** Normalize bone weights.
        Some exporters won't care if the sum of all bone weights
        for a single vertex equals 1 or not, so validate here. */
    const float epsilon = 0.05f;
    for (const uint32_t vertexIndex : influencedVertices)
    {
        float sum = 0.0f;
        for (VertexBoneAssignmentList::const_iterator baIter=dest->boneAssignments.begin(), baEnd=dest->boneAssignments.end(); baIter != baEnd; ++baIter)
        {
            if (baIter->vertexIndex == vertexIndex)
                sum += baIter->weight;
        }
        if ((sum < (1.0f - epsilon)) || (sum > (1.0f + epsilon)))
        {
            for (auto &boneAssign : dest->boneAssignments)
            {
                if (boneAssign.vertexIndex == vertexIndex)
                    boneAssign.weight /= sum;
            }
        }
    }

    ASSIMP_LOG_DEBUG_F( "  - ", dest->boneAssignments.size(), " bone assignments");
}